

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O0

int generate_tmp_file(char **tmp_name)

{
  char *pcVar1;
  char local_38 [8];
  char tmp_filename [22];
  int filedes;
  char **tmp_name_local;
  
  builtin_strncpy(local_38,"/tmp/eco",8);
  builtin_strncpy(tmp_filename,"nftool-XXXXXX",0xe);
  register0x00000000 = mkstemp(local_38);
  if (register0x00000000 == -1) {
    perror("mkstemp() failed");
    tmp_name_local._4_4_ = -1;
  }
  else {
    pcVar1 = strdup(local_38);
    *tmp_name = pcVar1;
    if (*tmp_name == (char *)0x0) {
      perror("out of memory!");
      tmp_name_local._4_4_ = -1;
    }
    else {
      tmp_name_local._4_4_ = 0;
    }
  }
  return tmp_name_local._4_4_;
}

Assistant:

static int generate_tmp_file(char **tmp_name)
{
    int filedes;
    char tmp_filename[] = "/tmp/econftool-XXXXXX";
    filedes = mkstemp(tmp_filename);
    if (filedes == -1) {
        perror("mkstemp() failed");
        return -1;
    }

    *tmp_name = strdup(tmp_filename);
    if (*tmp_name == NULL) {
        perror("out of memory!");
        return -1;
    }
    return 0;
}